

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_function_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,TextureFunctionNameArguments *args)

{
  SPIRType *pSVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  CompilerError *pCVar5;
  char *local_e0;
  char *local_d8;
  uint32_t local_84;
  bool workaround_lod_array_shadow_as_grad;
  SPIRType *pSStack_80;
  VariableID tex;
  SPIRType *imgtype;
  string fname;
  string local_50;
  TextureFunctionNameArguments *local_20;
  TextureFunctionNameArguments *args_local;
  CompilerGLSL *this_local;
  
  local_20 = args;
  args_local = (TextureFunctionNameArguments *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  if ((args->has_min_lod & 1U) != 0) {
    if (((this->options).es & 1U) != 0) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Sparse residency is not supported in ESSL.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_50,"GL_ARB_sparse_texture_clamp",
               (allocator *)(fname.field_2._M_local_buf + 0xf));
    require_extension_internal(this,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::allocator<char>::~allocator((allocator<char> *)(fname.field_2._M_local_buf + 0xf));
  }
  ::std::__cxx11::string::string((string *)&imgtype);
  pSVar1 = (local_20->base).imgtype;
  local_84 = (local_20->base).img.id;
  bVar3 = false;
  pSStack_80 = pSVar1;
  if (((((pSVar1->image).arrayed & 1U) != 0) && ((pSVar1->image).dim == Dim2D)) ||
     ((pSVar1->image).dim == Cube)) {
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_84);
    bVar2 = Compiler::is_depth_image(&this->super_Compiler,pSVar1,uVar4);
    if (((bVar2) && (local_20->lod != 0)) && (((local_20->base).is_fetch & 1U) == 0)) {
      bVar3 = expression_is_constant_null(this,local_20->lod);
      if (!bVar3) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar5,
                   "textureLod on sampler2DArrayShadow is not constant 0.0. This cannot be expressed in GLSL."
                  );
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      bVar3 = true;
    }
  }
  if ((local_20->is_sparse_feedback & 1U) != 0) {
    ::std::__cxx11::string::operator+=((string *)&imgtype,"sparse");
  }
  if (((local_20->base).is_fetch & 1U) == 0) {
    if ((local_20->is_sparse_feedback & 1U) == 0) {
      local_e0 = "texture";
    }
    else {
      local_e0 = "Texture";
    }
    ::std::__cxx11::string::operator+=((string *)&imgtype,local_e0);
    if (((local_20->base).is_gather & 1U) != 0) {
      ::std::__cxx11::string::operator+=((string *)&imgtype,"Gather");
    }
    if ((local_20->has_array_offsets & 1U) != 0) {
      ::std::__cxx11::string::operator+=((string *)&imgtype,"Offsets");
    }
    if (((local_20->base).is_proj & 1U) != 0) {
      ::std::__cxx11::string::operator+=((string *)&imgtype,"Proj");
    }
    if (((local_20->has_grad & 1U) != 0) || (bVar3)) {
      ::std::__cxx11::string::operator+=((string *)&imgtype,"Grad");
    }
    if ((local_20->lod != 0) && (!bVar3)) {
      ::std::__cxx11::string::operator+=((string *)&imgtype,"Lod");
    }
  }
  else {
    if ((local_20->is_sparse_feedback & 1U) == 0) {
      local_d8 = "texelFetch";
    }
    else {
      local_d8 = "TexelFetch";
    }
    ::std::__cxx11::string::operator+=((string *)&imgtype,local_d8);
  }
  if ((local_20->has_offset & 1U) != 0) {
    ::std::__cxx11::string::operator+=((string *)&imgtype,"Offset");
  }
  if ((local_20->has_min_lod & 1U) != 0) {
    ::std::__cxx11::string::operator+=((string *)&imgtype,"Clamp");
  }
  if (((local_20->is_sparse_feedback & 1U) != 0) || ((local_20->has_min_lod & 1U) != 0)) {
    ::std::__cxx11::string::operator+=((string *)&imgtype,"ARB");
  }
  bVar3 = is_legacy(this);
  pSVar1 = pSStack_80;
  if ((bVar3) && (((local_20->base).is_gather & 1U) == 0)) {
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_84);
    legacy_tex_op(__return_storage_ptr__,this,(string *)&imgtype,pSVar1,uVar4);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&imgtype);
  }
  ::std::__cxx11::string::~string((string *)&imgtype);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_function_name(const TextureFunctionNameArguments &args)
{
	if (args.has_min_lod)
	{
		if (options.es)
			SPIRV_CROSS_THROW("Sparse residency is not supported in ESSL.");
		require_extension_internal("GL_ARB_sparse_texture_clamp");
	}

	string fname;
	auto &imgtype = *args.base.imgtype;
	VariableID tex = args.base.img;

	// textureLod on sampler2DArrayShadow and samplerCubeShadow does not exist in GLSL for some reason.
	// To emulate this, we will have to use textureGrad with a constant gradient of 0.
	// The workaround will assert that the LOD is in fact constant 0, or we cannot emit correct code.
	// This happens for HLSL SampleCmpLevelZero on Texture2DArray and TextureCube.
	bool workaround_lod_array_shadow_as_grad = false;
	if (((imgtype.image.arrayed && imgtype.image.dim == Dim2D) || imgtype.image.dim == DimCube) &&
	    is_depth_image(imgtype, tex) && args.lod && !args.base.is_fetch)
	{
		if (!expression_is_constant_null(args.lod))
		{
			SPIRV_CROSS_THROW("textureLod on sampler2DArrayShadow is not constant 0.0. This cannot be "
			                  "expressed in GLSL.");
		}
		workaround_lod_array_shadow_as_grad = true;
	}

	if (args.is_sparse_feedback)
		fname += "sparse";

	if (args.base.is_fetch)
		fname += args.is_sparse_feedback ? "TexelFetch" : "texelFetch";
	else
	{
		fname += args.is_sparse_feedback ? "Texture" : "texture";

		if (args.base.is_gather)
			fname += "Gather";
		if (args.has_array_offsets)
			fname += "Offsets";
		if (args.base.is_proj)
			fname += "Proj";
		if (args.has_grad || workaround_lod_array_shadow_as_grad)
			fname += "Grad";
		if (args.lod != 0 && !workaround_lod_array_shadow_as_grad)
			fname += "Lod";
	}

	if (args.has_offset)
		fname += "Offset";

	if (args.has_min_lod)
		fname += "Clamp";

	if (args.is_sparse_feedback || args.has_min_lod)
		fname += "ARB";

	return (is_legacy() && !args.base.is_gather) ? legacy_tex_op(fname, imgtype, tex) : fname;
}